

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O2

timespec timespec_normalise(timespec ts)

{
  ulong uVar1;
  ulong uVar2;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  timespec tVar8;
  long lVar3;
  
  uVar6 = ts.tv_nsec;
  uVar1 = 999999999;
  if (999999999 < (long)uVar6) {
    uVar1 = uVar6;
  }
  uVar1 = uVar1 / 1000000000;
  lVar4 = uVar6 + uVar1 * -1000000000;
  lVar3 = -999999999;
  if (-999999999 < lVar4) {
    lVar3 = lVar4;
  }
  uVar2 = lVar3 + uVar1 * 1000000000;
  uVar7 = (ulong)(uVar2 != uVar6);
  lVar4 = ((uVar2 - uVar7) - uVar6) / 1000000000 + uVar7;
  lVar5 = lVar4 * 1000000000 + uVar6 + uVar1 * -1000000000;
  lVar3 = lVar5 + 1000000000;
  if (-1 < lVar5) {
    lVar3 = lVar5;
  }
  tVar8.tv_nsec = lVar3;
  tVar8.tv_sec = (lVar5 >> 0x3f) + ((uVar1 + ts.tv_sec) - lVar4);
  return tVar8;
}

Assistant:

static struct timespec timespec_normalise(struct timespec ts)
{
	while (ts.tv_nsec >= NSEC_PER_SEC) {
		++(ts.tv_sec);
		ts.tv_nsec -= NSEC_PER_SEC;
	}

	while (ts.tv_nsec <= -NSEC_PER_SEC) {
		--(ts.tv_sec);
		ts.tv_nsec += NSEC_PER_SEC;
	}

	if (ts.tv_nsec < 0) {
		/*
		 * Negative nanoseconds isn't valid according to
		 * POSIX. Decrement tv_sec and roll tv_nsec over.
		 */

		--(ts.tv_sec);
		ts.tv_nsec = (NSEC_PER_SEC + ts.tv_nsec);
	}

	return ts;
}